

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O3

void __thiscall
m2d::savanna::async_websocket::
reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
::control_callback(reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
                   *this,frame_type kind,string_view payload)

{
  state local_4;
  
  if (kind == close) {
    this->current_state_ = closed;
    if ((this->state_changed).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->state_changed)._M_invoker)((_Any_data *)&this->state_changed,&local_4);
  }
  return;
}

Assistant:

void control_callback(beast::websocket::frame_type kind, boost::string_view payload) override
			{
				if (kind == beast::websocket::frame_type::close) {
					this->set_current_state(closed);
				}
				boost::ignore_unused(kind, payload);
			}